

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O2

pair<std::error_code,_unsigned_long> * __thiscall
async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
          (pair<std::error_code,_unsigned_long> *__return_storage_ptr__,coro *this,
          Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy)

{
  error_category *peVar1;
  undefined4 uVar2;
  byte bVar3;
  pair<std::error_code,_unsigned_long> *ppVar4;
  Condition cond;
  Try<int> value;
  counting_semaphore<1L> local_44;
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  local_40;
  type local_20;
  
  if (*(long **)(*(long *)this + 0x18) != (long *)0x0) {
    bVar3 = (**(code **)(**(long **)(*(long *)this + 0x18) + 0x18))();
    logicAssert((bool)(bVar3 ^ 1),"do not sync await in the same executor with Lazy");
  }
  local_20.cond = (Condition *)&local_44;
  local_44._M_sem._M_counter = (__semaphore_impl)0;
  local_20.value = (Try<int> *)&local_40;
  local_40._M_index = '\0';
  detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)this,&local_20);
  std::counting_semaphore<1L>::acquire(&local_44);
  ppVar4 = Try<std::pair<std::error_code,_unsigned_long>_>::value
                     ((Try<std::pair<std::error_code,_unsigned_long>_> *)&local_40);
  __return_storage_ptr__->second = ppVar4->second;
  uVar2 = *(undefined4 *)&(ppVar4->first).field_0x4;
  peVar1 = (ppVar4->first)._M_cat;
  (__return_storage_ptr__->first)._M_value = (ppVar4->first)._M_value;
  *(undefined4 *)&(__return_storage_ptr__->first).field_0x4 = uVar2;
  (__return_storage_ptr__->first)._M_cat = peVar1;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}